

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

int __thiscall Units::setFlowFactor(Units *this,int flowUnits)

{
  int iVar1;
  double dVar2;
  string local_48 [8];
  string s;
  
  std::__cxx11::string::string(local_48,"CFS",(allocator *)(s.field_2._M_local_buf + 0xf));
  iVar1 = 0;
  switch(flowUnits) {
  case 0:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 1.0;
    break;
  case 1:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 448.831;
    break;
  case 2:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 0.64632;
    break;
  case 3:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 0.5382;
    break;
  case 4:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 1.9837;
    break;
  case 5:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 28.317;
    goto LAB_0012b502;
  case 6:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 1699.0;
    goto LAB_0012b502;
  case 7:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 2.4466;
    goto LAB_0012b502;
  case 8:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 101.94;
    goto LAB_0012b502;
  case 9:
    std::__cxx11::string::assign((char *)local_48);
    dVar2 = 2446.6;
LAB_0012b502:
    iVar1 = 1;
    break;
  default:
    dVar2 = 1.0;
    iVar1 = 0;
  }
  this->factors[5] = dVar2;
  std::__cxx11::string::_M_assign((string *)(this->names + 5));
  std::__cxx11::string::~string(local_48);
  return iVar1;
}

Assistant:

int Units::setFlowFactor(const int flowUnits)
{
    int    unitSystem = Options::US;
    double flowFactor = 1.0;
    string s = "CFS";

    switch(flowUnits)
    {
    case Options::CFS:  flowFactor = 1.0;
                        s = "CFS";
                        break;
    case Options::GPM:  flowFactor = GPMperCFS;
                        s = "GPM";
                        break;
    case Options::MGD:  flowFactor = MGDperCFS;
                        s = "MGD";
                        break;
    case Options::IMGD: flowFactor = IMGDperCFS;
                        s = "IMGD";
                        break;
    case Options::AFD:  flowFactor = AFDperCFS;
                        s = "AFD";
                        break;

    case Options::LPS:  flowFactor = LPSperCFS;
                        s = "LPS";
                        unitSystem = Options::SI;
                        break;
    case Options::LPM:  flowFactor = LPMperCFS;
                        s = "LPM";
                        unitSystem = Options::SI;
                        break;
    case Options::MLD:  flowFactor = MLDperCFS;
                        s = "MLD";
                        unitSystem = Options::SI;
                        break;
    case Options::CMH:  flowFactor = CMHperCFS;
                        s = "CMH";
                        unitSystem = Options::SI;
                        break;
    case Options::CMD:  flowFactor = CMDperCFS;
                        s = "CMD";
                        unitSystem = Options::SI;
                        break;
    }
    factors[FLOW] = flowFactor;
    names[FLOW] = s;
    return unitSystem;
}